

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaiser_window.cc
# Opt level: O2

double sptk::KaiserWindow::AttenuationToBeta(double attenuation)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (21.0 < attenuation) {
    if (attenuation <= 50.0) {
      dVar1 = pow(attenuation + -21.0,0.4);
      return dVar1 * 0.5842 + (attenuation + -21.0) * 0.07886;
    }
    dVar1 = (attenuation + -8.7) * 0.1102;
  }
  return dVar1;
}

Assistant:

double KaiserWindow::AttenuationToBeta(double attenuation) {
  double beta;
  if (attenuation <= 21.0) {
    beta = 0.0;
  } else if (attenuation <= 50.0) {
    const double a(attenuation - 21.0);
    beta = 0.5842 * std::pow(a, 0.4) + 0.07886 * a;
  } else {
    const double a(attenuation - 8.7);
    beta = 0.1102 * a;
  }
  return beta;
}